

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::Count
          (UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
  if (uVar1 < 0x4080) {
    uVar1 = uVar1 >> 7;
    while( true ) {
      this = (UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL> *)
             (this->m_inlineHeadBlock).Next;
      if (this == (UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>
                   *)0x0) {
        return (uint32)uVar1;
      }
      uVar2 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
      if (0x407f < uVar2) break;
      uVar1 = uVar1 + (uVar2 >> 7);
    }
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }